

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffs.c
# Opt level: O0

int FFSinternal_decode(FFSTypeHandle_conflict ioformat,char *src,void *dest,int to_buffer)

{
  FFSContext p_Var1;
  int iVar2;
  long in_RSI;
  FFSTypeHandle_conflict in_RDI;
  uint64_t *len_ptr_1;
  uint64_t record_len_1;
  int *len_ptr;
  int len_align_pad;
  int record_len;
  conversion_action params;
  int data_align_pad;
  int header_size;
  int align_pad;
  IOConversionStruct null_conv;
  int64_t input_record_len;
  IOConversionPtr_conflict conv;
  FFSContext iofile;
  long local_188;
  int *local_180;
  uint local_178;
  int local_174;
  void *local_170;
  void *local_168;
  void *local_150;
  void *local_140;
  uint local_124;
  int local_120;
  uint local_11c;
  IOconversion_type local_118;
  FMFieldList in_stack_fffffffffffffef0;
  int in_stack_fffffffffffffef8;
  undefined4 in_stack_fffffffffffffefc;
  void *in_stack_ffffffffffffff00;
  void *in_stack_ffffffffffffff08;
  IOConversionPtr in_stack_ffffffffffffff10;
  conversion_action_ptr in_stack_ffffffffffffff40;
  IOConversionPtr_conflict in_stack_ffffffffffffff48;
  conv_routine in_stack_ffffffffffffff50;
  FFSTypeHandle_conflict in_stack_ffffffffffffff58;
  long local_40;
  IOConversionPtr_conflict local_38;
  int local_4;
  
  p_Var1 = in_RDI->context;
  local_120 = FFSheader_size(in_RDI);
  local_38 = in_RDI->conversion;
  if (local_38 == (IOConversionPtr_conflict)0x0) {
    local_118 = none_required;
    in_stack_ffffffffffffff08 = (void *)0x3ff0000000000000;
    in_stack_fffffffffffffef8 = 0;
    in_stack_ffffffffffffff00 = (void *)0x0;
    in_stack_fffffffffffffef0 = (FMFieldList)0x0;
    local_38 = (IOConversionPtr_conflict)&local_118;
  }
  if (p_Var1 == local_38->context) {
    if (in_RDI == (FFSTypeHandle_conflict)0x0) {
      local_4 = 0;
    }
    else {
      if (in_RDI->body->variant == 0) {
        local_40 = (long)in_RDI->body->record_length;
      }
      else if (in_RDI->body->IOversion < 4) {
        local_178 = 4U - (in_RDI->body->server_ID).length & 3;
        local_180 = (int *)(in_RSI + (in_RDI->body->server_ID).length + (long)(int)local_178);
        local_174 = *local_180;
        if (in_RDI->body->byte_reversal != 0) {
          byte_swap((char *)&local_174,4);
        }
        local_40 = (long)local_174;
      }
      else {
        local_188 = *(long *)(in_RSI + (in_RDI->body->server_ID).length);
        if (in_RDI->body->byte_reversal != 0) {
          byte_swap((char *)&local_188,8);
        }
        local_40 = local_188;
      }
      local_11c = 8U - local_120 & 7;
      local_120 = local_11c + local_120;
      local_124 = 8U - in_RDI->body->record_length & 7;
      local_170 = (void *)(in_RSI + local_120);
      local_168 = (void *)((long)local_170 +
                          (long)(int)local_124 + (long)in_RDI->body->record_length);
      iVar2 = set_conversion_params
                        (in_stack_ffffffffffffff58,(int64_t)in_stack_ffffffffffffff50,
                         in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
      if (iVar2 == 0) {
        local_4 = 0;
      }
      else {
        if (local_150 != local_170) {
          memcpy(local_150,local_170,(long)in_RDI->body->record_length);
        }
        if ((local_140 != local_168) &&
           (0 < (local_40 - in_RDI->body->record_length) - (long)(int)local_124)) {
          memcpy(local_140,local_168,(local_40 - in_RDI->body->record_length) - (long)(int)local_124
                );
        }
        if (local_38->conversion_type != none_required) {
          FFSconvert_record(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,
                            in_stack_ffffffffffffff00,
                            (void *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
                            in_stack_fffffffffffffef0);
        }
        local_4 = 1;
      }
    }
  }
  else {
    fprintf(_stderr,"IOFile and conversion mismatch\n");
    local_4 = -1;
  }
  return local_4;
}

Assistant:

static int
FFSinternal_decode(FFSTypeHandle ioformat, char *src, void *dest, int to_buffer)
{
    FFSContext iofile = ioformat->context;
    IOConversionPtr conv;
    int64_t input_record_len;
    IOConversionStruct null_conv;
    int align_pad;
    int header_size = FFSheader_size(ioformat);
    int data_align_pad;
    conversion_action params;

    conv = ioformat->conversion;

    if (conv == NULL) {
	null_conv.conversion_type = none_required;
	null_conv.max_var_expansion = 1.0;
	null_conv.conv_count = 0;
	null_conv.base_size_delta = 0;
	null_conv.context = iofile;
	null_conv.ioformat = ioformat;
	null_conv.native_field_list = NULL;
	conv = &null_conv;
    }
    if (iofile != conv->context) {
	fprintf(stderr, "IOFile and conversion mismatch\n");
	return -1;
    }
    if (ioformat == NULL)
	return 0;

    if (ioformat->body->variant) {
	if (ioformat->body->IOversion <= 3) {
	    FILE_INT record_len;
	    int len_align_pad = (4 - ioformat->body->server_ID.length) & 3;
	    FILE_INT *len_ptr = (FILE_INT *) (src + ioformat->body->server_ID.length +
					      len_align_pad);
	    memcpy(&record_len, len_ptr, 4);
	    if (ioformat->body->byte_reversal)
		byte_swap((char *) &record_len, 4);
	    input_record_len = record_len;
	} else {
	    uint64_t record_len;
	    uint64_t *len_ptr = (uint64_t *) (src + ioformat->body->server_ID.length);
	    memcpy(&record_len, len_ptr, 8);
	    if (ioformat->body->byte_reversal)
		byte_swap((char *) &record_len, 8);
	    input_record_len = record_len;
	}
    } else {
	input_record_len = ioformat->body->record_length;
    }
    align_pad = (8 - header_size) & 0x7;
    header_size += align_pad;
    data_align_pad = (8 - ioformat->body->record_length) & 0x7;

    params.cur_base = src + header_size;
    params.cur_variant = params.cur_base + ioformat->body->record_length +
	data_align_pad;
    params.final_base = dest;
    params.variant_with_base = to_buffer;
    if (!set_conversion_params(ioformat, input_record_len, conv, &params))
	return 0;

    /* update stats 
    iofile->stats.decode_bytes += input_record_len;
    iofile->stats.decode_msg_count++;*/

    if (params.src_address != params.cur_base) {
	memcpy(params.src_address, params.cur_base, ioformat->body->record_length);
    }
    if (params.src_string_address != params.cur_variant) {
	if (input_record_len - ioformat->body->record_length - data_align_pad > 0) {
	    memcpy(params.src_string_address, params.cur_variant,
		   input_record_len - ioformat->body->record_length - data_align_pad);
	}
    }
    if (conv->conversion_type != none_required) {
	FFSconvert_record(conv, params.src_address, params.dest_address,
			 params.final_string_address,
			 params.src_string_address);
    }
    return 1;
}